

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatefootprint.cpp
# Opt level: O2

void __thiscall ValidateFootprint::StoreLine(ValidateFootprint *this)

{
  Validate *__s;
  int *piVar1;
  AREAPERIL_INT AVar2;
  size_t sVar3;
  
  __s = &this->super_Validate;
  piVar1 = &(this->super_Validate).lineno_;
  *piVar1 = *piVar1 + 1;
  AVar2 = (this->fr_).super_EventRow.areaperil_id;
  this->prevEventID_ = (this->fr_).event_id;
  this->prevAreaPerilID_ = AVar2;
  sVar3 = strlen(__s->line_);
  memcpy(this->prevLine_,__s,sVar3 + 1);
  sVar3 = strlen(__s->line_);
  this->prevLine_[sVar3 - 1] = '\0';
  return;
}

Assistant:

inline void ValidateFootprint::StoreLine() {
/* Store current line before going to the next one. Used in some error message
 * output. */

    ++lineno_;
    prevEventID_ = fr_.event_id;
    prevAreaPerilID_ = fr_.areaperil_id;

    memcpy(prevLine_, line_, strlen(line_) + 1);
    prevLine_[strlen(line_) - 1] = '\0';

}